

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_data.hpp
# Opt level: O0

void duckdb::ArrowListData<int>::Initialize
               (ArrowAppendData *result,LogicalType *type,idx_t capacity)

{
  LogicalType *__x;
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  *in_RDX;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  child_buffer;
  LogicalType *child_type;
  LogicalType *in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  ArrowBuffer *in_stack_ffffffffffffffb0;
  
  __x = ListType::GetChildType(in_stack_ffffffffffffffa0);
  ArrowAppendData::GetMainBuffer((ArrowAppendData *)0x153c01c);
  ArrowBuffer::reserve(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)in_RDX,__x);
  ArrowAppender::InitializeChild
            (type,capacity,(ClientProperties *)child_type,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)
             child_buffer.
             super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
             .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl);
  shared_ptr<duckdb::ArrowTypeExtensionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)0x153c090);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>_>_>
  ::push_back(in_RDX,(value_type *)__x);
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
               *)0x153c0af);
  return;
}

Assistant:

static void Initialize(ArrowAppendData &result, const LogicalType &type, idx_t capacity) {
		auto &child_type = ListType::GetChildType(type);
		result.GetMainBuffer().reserve((capacity + 1) * sizeof(BUFTYPE));
		auto child_buffer = ArrowAppender::InitializeChild(child_type, capacity, result.options);
		result.child_data.push_back(std::move(child_buffer));
	}